

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O1

void __thiscall spv::Instruction::~Instruction(Instruction *this)

{
  ~Instruction(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

virtual ~Instruction() {}